

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeFaceWrapper.cpp
# Opt level: O1

FT_UShort __thiscall FreeTypeFaceWrapper::GetFontWeight(FreeTypeFaceWrapper *this)

{
  FT_UShort FVar1;
  uint uVar2;
  
  if (this->mFormatParticularWrapper != (IFreeTypeFaceExtender *)0x0) {
    uVar2 = (*this->mFormatParticularWrapper->_vptr_IFreeTypeFaceExtender[7])();
    if ((uVar2 & 0xffff) != 1000) {
      return (FT_UShort)uVar2;
    }
  }
  FVar1 = WeightFromName(this);
  return FVar1;
}

Assistant:

FT_UShort FreeTypeFaceWrapper::GetFontWeight()
{
	if(mFormatParticularWrapper)
	{
		FT_UShort result = mFormatParticularWrapper->GetFontWeight();
		if(1000 == result) // 1000 marks unknown
			return WeightFromName();
		else
			return result;
	}
	return WeightFromName();
}